

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O2

MarkReference * __thiscall DataBuffer::addReference(DataBuffer *this,ByteMark *mark)

{
  MarkReference *ref;
  
  ref = (MarkReference *)operator_new(0x10);
  ref->target = mark;
  ref->pos = *(int *)&this->m_position - *(int *)&this->m_buffer;
  List<MarkReference_*>::append(&this->m_references,&ref);
  writeDWord(this,-0x41103502);
  return ref;
}

Assistant:

MarkReference* DataBuffer::addReference (ByteMark* mark)
{
	MarkReference* ref = new MarkReference;
	ref->target = mark;
	ref->pos = writtenSize();
	m_references << ref;

	// Write a dummy placeholder for the reference
	writeDWord (0xBEEFCAFE);

	return ref;
}